

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O3

tuple<TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
helics::apps::Clone::getValue_abi_cxx11_
          (tuple<TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Clone *this,int index)

{
  pointer pVVar1;
  baseType bVar2;
  string *__head;
  pointer pVVar3;
  long lVar4;
  _Elt_pointer pIVar5;
  undefined7 local_3e;
  undefined1 uStack_37;
  undefined7 uStack_36;
  undefined7 local_2f;
  undefined1 uStack_28;
  undefined7 uStack_27;
  
  if ((index < 0) ||
     (pVVar3 = (this->points).
               super__Vector_base<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (int)((ulong)((long)(this->points).
                         super__Vector_base<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3) >> 4) *
     -0x55555555 <= index)) {
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->
                   super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).
                   super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ._M_head_impl.field_2;
    bVar2 = 0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._M_local_buf[0] = '\0';
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).
                      super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl.field_2 + 1) = CONCAT17(uStack_37,local_3e);
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).
                      super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl.field_2 + 8) = CONCAT71(uStack_36,uStack_37);
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_string_length = 0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->
                   super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).
                   super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ._M_head_impl.field_2;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._M_local_buf[0] = '\0';
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).
                      super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl.field_2 + 1) = CONCAT17(uStack_28,local_2f);
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).
                      super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl.field_2 + 8) = CONCAT71(uStack_27,uStack_28);
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_string_length = 0;
  }
  else {
    pIVar5 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    lVar4 = ((long)pIVar5 -
             (long)(this->subscriptions).
                   super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                   super__Deque_impl_data._M_start._M_first >> 4) * -0x79435e50d79435e5 +
            (long)pVVar3[(uint)index].index;
    if (lVar4 == 0) {
      pIVar5 = pIVar5 + pVVar3[(uint)index].index;
    }
    else {
      pIVar5 = (this->subscriptions).
               super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
               super__Deque_impl_data._M_start._M_node[lVar4];
    }
    pVVar1 = pVVar3 + (uint)index;
    if ((pIVar5->givenTarget)._M_string_length == 0) {
      __head = Interface::getSourceTargets_abi_cxx11_(&pIVar5->super_Interface);
      pVVar3 = (this->points).
               super__Vector_base<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      __head = &pIVar5->givenTarget;
    }
    CLI::std::
    _Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Tuple_impl((_Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)__return_storage_ptr__,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__head,
                  &pVVar3[(uint)index].value);
    bVar2 = (pVVar1->time).internalTimeCode;
  }
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super__Head_base<0UL,_TimeRepresentation<count_time<9,_long>_>,_false>._M_head_impl.
  internalTimeCode = bVar2;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<Time, std::string, std::string> Clone::getValue(int index) const
{
    if (isValidIndex(index, points)) {
        return {points[index].time,
                subscriptions[points[index].index].getTarget(),
                points[index].value};
    }
    return {Time(), std::string(), std::string()};
}